

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O3

void canvas_writescalar(t_symbol *templatesym,t_word *w,_binbuf *b,int amarrayelement)

{
  _array *p_Var1;
  t_symbol *templatesym_00;
  t_template *ptVar2;
  t_atom *argv;
  int iVar3;
  long lVar4;
  long lVar5;
  size_t oldsize;
  t_atom *ptVar6;
  ulong uVar7;
  t_word *ptVar8;
  ulong uVar9;
  t_atom templatename;
  t_atom local_40;
  
  ptVar2 = template_findbyname(templatesym);
  uVar7 = 0;
  argv = (t_atom *)getbytes(0);
  if (ptVar2 != (t_template *)0x0) {
    uVar7 = (ulong)(uint)ptVar2->t_n;
  }
  if (amarrayelement == 0) {
    local_40.a_type = A_SYMBOL;
    local_40.a_w.w_symbol = gensym(templatesym->s_name + 3);
    binbuf_add(b,1,&local_40);
  }
  if (ptVar2 == (t_template *)0x0) {
    bug("canvas_writescalar");
  }
  if ((int)uVar7 < 1) {
    iVar3 = 0;
  }
  else {
    lVar5 = 0;
    iVar3 = 0;
    ptVar8 = w;
    do {
      if (*(uint *)((long)&ptVar2->t_vec->ds_type + lVar5) < 2) {
        lVar4 = (long)iVar3;
        oldsize = lVar4 * 0x10;
        iVar3 = iVar3 + 1;
        argv = (t_atom *)resizebytes(argv,oldsize,oldsize + 0x10);
        ptVar6 = argv + lVar4;
        if (*(int *)((long)&ptVar2->t_vec->ds_type + lVar5) == 0) {
          ptVar6->a_type = A_FLOAT;
          (ptVar6->a_w).w_float = ptVar8->w_float;
        }
        else {
          ptVar6->a_type = A_SYMBOL;
          ptVar6->a_w = *ptVar8;
        }
      }
      ptVar8 = ptVar8 + 1;
      lVar5 = lVar5 + 0x18;
    } while (uVar7 * 0x18 != lVar5);
  }
  if (iVar3 == 0 && amarrayelement != 0) {
    argv->a_type = A_SYMBOL;
    (argv->a_w).w_symbol = &s_bang;
    iVar3 = 1;
  }
  binbuf_add(b,iVar3,argv);
  binbuf_addsemi(b);
  freebytes(argv,(long)iVar3 << 4);
  if (0 < (int)uVar7) {
    uVar9 = 0;
    do {
      iVar3 = ptVar2->t_vec[uVar9].ds_type;
      if (iVar3 == 2) {
        binbuf_savetext(w[uVar9].w_binbuf,b);
      }
      else if (iVar3 == 3) {
        p_Var1 = w[uVar9].w_array;
        lVar5 = (long)p_Var1->a_n;
        if (0 < lVar5) {
          templatesym_00 = ptVar2->t_vec[uVar9].ds_arraytemplate;
          iVar3 = p_Var1->a_elemsize;
          lVar4 = 0;
          do {
            canvas_writescalar(templatesym_00,(t_word *)(p_Var1->a_vec + lVar4),b,1);
            lVar4 = lVar4 + iVar3;
            lVar5 = lVar5 + -1;
          } while (lVar5 != 0);
        }
        binbuf_addsemi(b);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar7);
  }
  return;
}

Assistant:

void canvas_writescalar(t_symbol *templatesym, t_word *w, t_binbuf *b,
    int amarrayelement)
{
    t_template *template = template_findbyname(templatesym);
    t_atom *a = (t_atom *)t_getbytes(0);
    int i, n = template?(template->t_n):0, natom = 0;
    if (!amarrayelement)
    {
        t_atom templatename;
        SETSYMBOL(&templatename, gensym(templatesym->s_name + 3));
        binbuf_add(b, 1, &templatename);
    }
    if (!template)
        bug("canvas_writescalar");
        /* write the atoms (floats and symbols) */
    for (i = 0; i < n; i++)
    {
        if (template->t_vec[i].ds_type == DT_FLOAT ||
            template->t_vec[i].ds_type == DT_SYMBOL)
        {
            a = (t_atom *)t_resizebytes(a,
                natom * sizeof(*a), (natom + 1) * sizeof (*a));
            if (template->t_vec[i].ds_type == DT_FLOAT)
                SETFLOAT(a + natom, w[i].w_float);
            else SETSYMBOL(a + natom,  w[i].w_symbol);
            natom++;
        }
    }
        /* array elements have to have at least something */
    if (natom == 0 && amarrayelement)
        SETSYMBOL(a + natom,  &s_bang), natom++;
    binbuf_add(b, natom, a);
    binbuf_addsemi(b);
    t_freebytes(a, natom * sizeof(*a));
    for (i = 0; i < n; i++)
    {
        if (template->t_vec[i].ds_type == DT_ARRAY)
        {
            int j;
            t_array *a = w[i].w_array;
            int elemsize = a->a_elemsize, nitems = a->a_n;
            t_symbol *arraytemplatesym = template->t_vec[i].ds_arraytemplate;
            for (j = 0; j < nitems; j++)
                canvas_writescalar(arraytemplatesym,
                    (t_word *)(((char *)a->a_vec) + elemsize * j), b, 1);
            binbuf_addsemi(b);
        }
        else if (template->t_vec[i].ds_type == DT_TEXT)
            binbuf_savetext(w[i].w_binbuf, b);
    }
}